

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPInternalSourceData::ProcessPrivateSDESItem
          (RTPInternalSourceData *this,uint8_t *prefix,size_t prefixlen,uint8_t *value,
          size_t valuelen,RTPTime *receivetime)

{
  int iVar1;
  
  (this->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t;
  iVar1 = RTCPSDESInfo::SetPrivateValue
                    (&(this->super_RTPSourceData).SDESinf,prefix,prefixlen,value,valuelen);
  if (iVar1 == -0x38) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPInternalSourceData::ProcessPrivateSDESItem(const uint8_t *prefix,size_t prefixlen,const uint8_t *value,size_t valuelen,const RTPTime &receivetime)
{
	int status;
	
	stats.SetLastMessageTime(receivetime);
	status = SDESinf.SetPrivateValue(prefix,prefixlen,value,valuelen);
	if (status == ERR_RTP_SDES_MAXPRIVITEMS)
		return 0; // don't stop processing just because the number of items is full
	return status;
}